

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_crc32.c
# Opt level: O0

void csp_crc32_update(csp_crc32_t *crc,void *data,uint32_t length)

{
  uint8_t *data8;
  uint32_t length_local;
  void *data_local;
  csp_crc32_t *crc_local;
  
  data8 = (uint8_t *)data;
  length_local = length;
  if (crc != (csp_crc32_t *)0x0) {
    while (length_local != 0) {
      *crc = crc_tab[(ulong)(*crc ^ (uint)*data8) & 0xff] ^ *crc >> 8;
      data8 = data8 + 1;
      length_local = length_local - 1;
    }
  }
  return;
}

Assistant:

void csp_crc32_update(csp_crc32_t * crc, const void * data, uint32_t length) {

	const uint8_t * data8 = (uint8_t*)data;

	if (crc) {
		while (length--) {
#ifdef __AVR__
			crc = pgm_read_dword(&crc_tab[(crc ^ *data8++) & 0xFFL]) ^ (crc >> 8);
#else
			(*crc) = crc_tab[((*crc) ^ *data8++) & 0xFFL] ^ ((*crc) >> 8);
#endif
		}
	}
}